

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-parse.h
# Opt level: O2

pair<unsigned_long,_const_char_*> parseunsigned<char_const*>(char *first,char *last,int base)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  pair<unsigned_long,_const_char_*> pVar9;
  
  uVar8 = 0;
  iVar5 = 0;
  iVar6 = 0;
  for (pcVar7 = first; pcVar7 < last; pcVar7 = pcVar7 + 1) {
    uVar1 = char2nyble<char>(*pcVar7);
    uVar3 = (ulong)uVar1;
    if (base == 0) {
      if (iVar5 == 1) {
        if (*pcVar7 == 'x') {
          base = 0x10;
        }
        else if (*pcVar7 == 'b') {
          base = 2;
        }
        else {
          pcVar4 = pcVar7;
          uVar2 = uVar8;
          if (uVar1 == 0xffffffff) goto LAB_001041c2;
          if (7 < uVar1) {
            if ((int)uVar1 < 8) goto LAB_00104196;
            goto LAB_001041a6;
          }
          iVar6 = 1;
          base = 8;
          uVar8 = uVar3;
        }
      }
      else {
        if (iVar5 != 0) goto LAB_001041a6;
        if (8 < uVar1 - 1) {
          if (uVar1 == 0) {
LAB_00104196:
            base = 0;
            iVar5 = 1;
            goto LAB_00104199;
          }
          goto LAB_001041a6;
        }
        iVar6 = 1;
        base = 10;
        uVar8 = uVar3;
      }
      iVar5 = 3;
    }
    else {
      if (((int)uVar1 < 0) || (base <= (int)uVar1)) break;
      uVar8 = uVar8 * (uint)base + uVar3;
      iVar6 = iVar6 + 1;
    }
LAB_00104199:
  }
  if (iVar5 == 2) {
LAB_001041a6:
    pcVar4 = first;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    pcVar4 = first;
    if (iVar5 != 3 || iVar6 != 0) {
      pcVar4 = pcVar7;
      uVar2 = uVar8;
    }
  }
LAB_001041c2:
  pVar9.second = pcVar4;
  pVar9.first = uVar2;
  return pVar9;
}

Assistant:

std::pair<uint64_t, P> parseunsigned(P first, P last, int base)
{
    int state = 0;    // 3 = foundbase, 2 = invalid, 1 = found '0', 0 = initial state.
    int digits = 0;
    uint64_t num = 0;
    auto p = first;
    while (p<last)
    {
        int n = char2nyble(*p);
        if (base==0) {
            if (state==0) {
                if (1<=n && n<=9) {
                    base = 10;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n==0) {
                    // expect 0<octal>, 0b<binary>, 0x<hex>
                    state = 1;
                }
                else {
                    // invalid
                    state = 2;
                    break;
                }
            }
            else if (state==1) {
                if (*p == 'x') {
                    base = 16;
                    state = 3;
                }
                else if (*p == 'b') {
                    base = 2;
                    state = 3;
                }
                else if (n==-1) {
                    // just a single '0' followed by a non digit
                    // -> return '0'
                    break;
                }
                else if (0<=n && n<=7) {
                    base = 8;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n>=8) {
                    // invalid octal digit
                    state = 2;
                    break;
                }
            }
            else {
                // invalid
                state = 2;
                break;
            }
        }
        else {
            if (n<0 || n>=base) {
                // end of number
                break;
            }
            num *= base;
            num += n;
            digits++;
        }

        ++p;
    }
    if (state==2)  // invalid
        return std::make_pair(0, first);

    if (state==3 && digits==0) {
        // "0x" and "0b" are invalid numbers, they expect digits.
        return std::make_pair(0, first);
    }
    return std::make_pair(num, p);
}